

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

void __thiscall
GlobalSimpleStringMemoryAccountant::~GlobalSimpleStringMemoryAccountant
          (GlobalSimpleStringMemoryAccountant *this)

{
  MemoryAccountant *this_00;
  
  restoreAllocator(this);
  this_00 = this->accountant_;
  if (this_00 != (MemoryAccountant *)0x0) {
    MemoryAccountant::~MemoryAccountant(this_00);
  }
  operator_delete(this_00,0x18);
  if (this->allocator_ != (AccountingTestMemoryAllocator *)0x0) {
    (*(this->allocator_->super_TestMemoryAllocator)._vptr_TestMemoryAllocator[1])();
    return;
  }
  return;
}

Assistant:

GlobalSimpleStringMemoryAccountant::~GlobalSimpleStringMemoryAccountant()
{
    restoreAllocator();

    delete accountant_;
    delete allocator_;
}